

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS
ref_node_tet_epic_dquality_dnode0
          (REF_NODE ref_node,REF_INT *nodes,REF_DBL *quality,REF_DBL *d_quality)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double local_208;
  double local_1f8;
  double local_1f0;
  double local_1e8;
  double local_1e0;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL m [6];
  int local_15c;
  REF_INT i;
  REF_DBL d_denom [3];
  double dStack_138;
  REF_DBL d_num [3];
  REF_DBL denom;
  REF_DBL num;
  REF_DBL d_volume_in_metric [3];
  REF_DBL volume_in_metric;
  REF_DBL d_volume [3];
  REF_DBL volume;
  REF_DBL min_det;
  REF_DBL det;
  REF_DBL d_l2 [3];
  REF_DBL local_98;
  REF_DBL d_l1 [3];
  REF_DBL local_78;
  REF_DBL d_l0 [3];
  REF_DBL l5;
  REF_DBL l4;
  REF_DBL l3;
  REF_DBL l2;
  REF_DBL l1;
  REF_DBL l0;
  REF_DBL *d_quality_local;
  REF_DBL *quality_local;
  REF_INT *nodes_local;
  REF_NODE ref_node_local;
  
  l0 = (REF_DBL)d_quality;
  d_quality_local = quality;
  quality_local = (REF_DBL *)nodes;
  nodes_local = &ref_node->n;
  uVar1 = ref_node_dratio_dnode0(ref_node,*nodes,nodes[1],&l1,&local_78);
  if (uVar1 == 0) {
    uVar1 = ref_node_dratio_dnode0
                      ((REF_NODE)nodes_local,*(REF_INT *)quality_local,
                       *(REF_INT *)(quality_local + 1),&l2,&local_98);
    if (uVar1 == 0) {
      uVar1 = ref_node_dratio_dnode0
                        ((REF_NODE)nodes_local,*(REF_INT *)quality_local,
                         *(REF_INT *)((long)quality_local + 0xc),&l3,&det);
      if (uVar1 == 0) {
        uVar1 = ref_node_ratio((REF_NODE)nodes_local,*(REF_INT *)((long)quality_local + 4),
                               *(REF_INT *)(quality_local + 1),&l4);
        if (uVar1 == 0) {
          uVar1 = ref_node_ratio((REF_NODE)nodes_local,*(REF_INT *)((long)quality_local + 4),
                                 *(REF_INT *)((long)quality_local + 0xc),&l5);
          if (uVar1 == 0) {
            uVar1 = ref_node_ratio((REF_NODE)nodes_local,*(REF_INT *)(quality_local + 1),
                                   *(REF_INT *)((long)quality_local + 0xc),d_l0 + 2);
            if (uVar1 == 0) {
              uVar1 = ref_node_tet_dvol_dnode0
                                ((REF_NODE)nodes_local,(REF_INT *)quality_local,d_volume + 2,
                                 &volume_in_metric);
              if (uVar1 == 0) {
                if (*(double *)(nodes_local + 0x1e) < d_volume[2]) {
                  uVar1 = ref_node_metric_get((REF_NODE)nodes_local,*(REF_INT *)quality_local,
                                              (REF_DBL *)&ref_private_macro_code_rss_1);
                  if (uVar1 == 0) {
                    uVar1 = ref_matrix_det_m((REF_DBL *)&ref_private_macro_code_rss_1,&min_det);
                    local_1e0 = min_det;
                    if (uVar1 == 0) {
                      uVar1 = ref_node_metric_get((REF_NODE)nodes_local,
                                                  *(REF_INT *)((long)quality_local + 4),
                                                  (REF_DBL *)&ref_private_macro_code_rss_1);
                      if (uVar1 == 0) {
                        uVar1 = ref_matrix_det_m((REF_DBL *)&ref_private_macro_code_rss_1,&min_det);
                        if (uVar1 == 0) {
                          if (min_det <= local_1e0) {
                            local_1e0 = min_det;
                          }
                          else {
                          }
                          uVar1 = ref_node_metric_get((REF_NODE)nodes_local,
                                                      *(REF_INT *)(quality_local + 1),
                                                      (REF_DBL *)&ref_private_macro_code_rss_1);
                          if (uVar1 == 0) {
                            uVar1 = ref_matrix_det_m((REF_DBL *)&ref_private_macro_code_rss_1,
                                                     &min_det);
                            if (uVar1 == 0) {
                              if (min_det <= local_1e0) {
                                local_1e8 = min_det;
                              }
                              else {
                                local_1e8 = local_1e0;
                              }
                              uVar1 = ref_node_metric_get((REF_NODE)nodes_local,
                                                          *(REF_INT *)((long)quality_local + 0xc),
                                                          (REF_DBL *)&ref_private_macro_code_rss_1);
                              if (uVar1 == 0) {
                                uVar1 = ref_matrix_det_m((REF_DBL *)&ref_private_macro_code_rss_1,
                                                         &min_det);
                                if (uVar1 == 0) {
                                  if (min_det <= local_1e8) {
                                    local_1f0 = min_det;
                                  }
                                  else {
                                    local_1f0 = local_1e8;
                                  }
                                  dVar2 = sqrt(local_1f0);
                                  d_volume_in_metric[2] = dVar2 * d_volume[2];
                                  for (local_15c = 0; local_15c < 3; local_15c = local_15c + 1) {
                                    dVar2 = sqrt(local_1f0);
                                    d_volume_in_metric[(long)local_15c + -1] =
                                         dVar2 * d_volume[(long)local_15c + -1];
                                  }
                                  dVar2 = pow(d_volume_in_metric[2],0.6666666666666666);
                                  for (local_15c = 0; local_15c < 3; local_15c = local_15c + 1) {
                                    dVar3 = pow(d_volume_in_metric[2],-0.3333333333333333);
                                    d_num[(long)local_15c + -1] =
                                         dVar3 * 0.6666666666666666 *
                                         d_volume_in_metric[(long)local_15c + -1];
                                  }
                                  dVar3 = d_l0[2] * d_l0[2] +
                                          l5 * l5 + l4 * l4 + l3 * l3 + l1 * l1 + l2 * l2;
                                  for (local_15c = 0; local_15c < 3; local_15c = local_15c + 1) {
                                    *(double *)(&stack0xfffffffffffffea8 + (long)local_15c * 8) =
                                         l3 * 2.0 * d_l2[(long)local_15c + -1] +
                                         l1 * 2.0 * d_l0[(long)local_15c + -1] +
                                         l2 * 2.0 * d_l1[(long)local_15c + -1];
                                  }
                                  if (dVar3 * 1e+20 <= 0.0) {
                                    local_1f8 = -(dVar3 * 1e+20);
                                  }
                                  else {
                                    local_1f8 = dVar3 * 1e+20;
                                  }
                                  local_208 = dVar2;
                                  if (dVar2 <= 0.0) {
                                    local_208 = -dVar2;
                                  }
                                  if (local_1f8 <= local_208) {
                                    *d_quality_local = -1.0;
                                    for (local_15c = 0; local_15c < 3; local_15c = local_15c + 1) {
                                      *(undefined8 *)((long)l0 + (long)local_15c * 8) = 0;
                                    }
                                  }
                                  else {
                                    *d_quality_local = (dVar2 * 24.9610058766228) / dVar3;
                                    for (local_15c = 0; local_15c < 3; local_15c = local_15c + 1) {
                                      *(double *)((long)l0 + (long)local_15c * 8) =
                                           (((d_num[(long)local_15c + -1] * dVar3 +
                                             -(dVar2 * *(double *)
                                                        (&stack0xfffffffffffffea8 +
                                                        (long)local_15c * 8))) * 24.9610058766228) /
                                           dVar3) / dVar3;
                                    }
                                  }
                                  ref_node_local._4_4_ = 0;
                                }
                                else {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                                         ,0x6cf,"ref_node_tet_epic_dquality_dnode0",(ulong)uVar1,
                                         "n3");
                                  ref_node_local._4_4_ = uVar1;
                                }
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                                       ,0x6ce,"ref_node_tet_epic_dquality_dnode0",(ulong)uVar1,
                                       "nodes[3] m");
                                ref_node_local._4_4_ = uVar1;
                              }
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                                     ,0x6cb,"ref_node_tet_epic_dquality_dnode0",(ulong)uVar1,"n2");
                              ref_node_local._4_4_ = uVar1;
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                                   ,0x6ca,"ref_node_tet_epic_dquality_dnode0",(ulong)uVar1,
                                   "nodes[2] m");
                            ref_node_local._4_4_ = uVar1;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                                 ,0x6c7,"ref_node_tet_epic_dquality_dnode0",(ulong)uVar1,"n1");
                          ref_node_local._4_4_ = uVar1;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                               ,0x6c6,"ref_node_tet_epic_dquality_dnode0",(ulong)uVar1,"nodes[1] m")
                        ;
                        ref_node_local._4_4_ = uVar1;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                             ,0x6c3,"ref_node_tet_epic_dquality_dnode0",(ulong)uVar1,"n0");
                      ref_node_local._4_4_ = uVar1;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                           ,0x6c2,"ref_node_tet_epic_dquality_dnode0",(ulong)uVar1,"nodes[0] m");
                    ref_node_local._4_4_ = uVar1;
                  }
                }
                else {
                  *d_quality_local = d_volume[2] - *(double *)(nodes_local + 0x1e);
                  for (local_15c = 0; local_15c < 3; local_15c = local_15c + 1) {
                    *(REF_DBL *)((long)l0 + (long)local_15c * 8) = d_volume[(long)local_15c + -1];
                  }
                  ref_node_local._4_4_ = 0;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                       ,0x6ba,"ref_node_tet_epic_dquality_dnode0",(ulong)uVar1,"vol");
                ref_node_local._4_4_ = uVar1;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                     ,0x6b8,"ref_node_tet_epic_dquality_dnode0",(ulong)uVar1,"l5");
              ref_node_local._4_4_ = uVar1;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x6b7,"ref_node_tet_epic_dquality_dnode0",(ulong)uVar1,"l4");
            ref_node_local._4_4_ = uVar1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x6b6,"ref_node_tet_epic_dquality_dnode0",(ulong)uVar1,"l3");
          ref_node_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x6b5,"ref_node_tet_epic_dquality_dnode0",(ulong)uVar1,"l2");
        ref_node_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x6b4,
             "ref_node_tet_epic_dquality_dnode0",(ulong)uVar1,"l1");
      ref_node_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x6b3,
           "ref_node_tet_epic_dquality_dnode0",(ulong)uVar1,"l0");
    ref_node_local._4_4_ = uVar1;
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_node_tet_epic_dquality_dnode0(
    REF_NODE ref_node, REF_INT *nodes, REF_DBL *quality, REF_DBL *d_quality) {
  REF_DBL l0, l1, l2, l3, l4, l5;
  REF_DBL d_l0[3], d_l1[3], d_l2[3];

  REF_DBL det, min_det, volume, d_volume[3];
  REF_DBL volume_in_metric, d_volume_in_metric[3];
  REF_DBL num, denom;
  REF_DBL d_num[3], d_denom[3];
  REF_INT i;
  REF_DBL m[6];

  RSS(ref_node_dratio_dnode0(ref_node, nodes[0], nodes[1], &l0, d_l0), "l0");
  RSS(ref_node_dratio_dnode0(ref_node, nodes[0], nodes[2], &l1, d_l1), "l1");
  RSS(ref_node_dratio_dnode0(ref_node, nodes[0], nodes[3], &l2, d_l2), "l2");
  RSS(ref_node_ratio(ref_node, nodes[1], nodes[2], &l3), "l3");
  RSS(ref_node_ratio(ref_node, nodes[1], nodes[3], &l4), "l4");
  RSS(ref_node_ratio(ref_node, nodes[2], nodes[3], &l5), "l5");

  RSS(ref_node_tet_dvol_dnode0(ref_node, nodes, &volume, d_volume), "vol");

  if (volume <= ref_node_min_volume(ref_node)) {
    *quality = volume - ref_node_min_volume(ref_node);
    for (i = 0; i < 3; i++) d_quality[i] = d_volume[i];
    return REF_SUCCESS;
  }

  RSS(ref_node_metric_get(ref_node, nodes[0], m), "nodes[0] m");
  RSS(ref_matrix_det_m(m, &det), "n0");
  min_det = det;

  RSS(ref_node_metric_get(ref_node, nodes[1], m), "nodes[1] m");
  RSS(ref_matrix_det_m(m, &det), "n1");
  min_det = MIN(min_det, det);

  RSS(ref_node_metric_get(ref_node, nodes[2], m), "nodes[2] m");
  RSS(ref_matrix_det_m(m, &det), "n2");
  min_det = MIN(min_det, det);

  RSS(ref_node_metric_get(ref_node, nodes[3], m), "nodes[3] m");
  RSS(ref_matrix_det_m(m, &det), "n3");
  min_det = MIN(min_det, det);

  volume_in_metric = sqrt(min_det) * volume;
  for (i = 0; i < 3; i++) d_volume_in_metric[i] = sqrt(min_det) * d_volume[i];

  num = pow(volume_in_metric, 2.0 / 3.0);
  for (i = 0; i < 3; i++)
    d_num[i] =
        2.0 / 3.0 * pow(volume_in_metric, -1.0 / 3.0) * d_volume_in_metric[i];
  denom = l0 * l0 + l1 * l1 + l2 * l2 + l3 * l3 + l4 * l4 + l5 * l5;
  for (i = 0; i < 3; i++)
    d_denom[i] = 2.0 * l0 * d_l0[i] + 2.0 * l1 * d_l1[i] + 2.0 * l2 * d_l2[i];

  if (ref_math_divisible(num, denom)) {
    /* 36/3^(1/3) */
    *quality = 24.9610058766228 * num / denom;
    for (i = 0; i < 3; i++)
      d_quality[i] = 24.9610058766228 * (d_num[i] * denom - num * d_denom[i]) /
                     denom / denom;
  } else {
    /* printf("%s: %d: %s: div zero vol %.18e min_det %.18e (%.18e / %.18e)\n",
       __FILE__, __LINE__, __func__, volume, min_det, num, denom); */
    *quality = -1.0;
    for (i = 0; i < 3; i++) d_quality[i] = 0.0;
  }

  return REF_SUCCESS;
}